

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O0

void entry_point_report(ReportWriter *writer,Trace *trace,AnnotationResolver *annotations)

{
  AnnotationResolver *annotations_local;
  Trace *trace_local;
  ReportWriter *writer_local;
  
  ReportWriter::writeSeperator(writer,"Entry point report");
  ReportWriter::writeComment(writer,"Disabled");
  return;
}

Assistant:

void entry_point_report(ReportWriter &writer, const Trace &trace, const AnnotationResolver &annotations) {
	writer.writeSeperator("Entry point report");
	writer.writeComment("Disabled");
/*
	struct FunctionInfo {
		int jumps_within_function = 0; // Could be interesting if we limit was sorts of jumps we count (jsr vs jmp)
		std::set<Pointer> targets_inside; // Lazy coding here
	};

	std::vector<FunctionInfo> stats(annotations._annotations.size());

	// We assume this is done when no branches are part of jumps
	for (JumpTrace::const_iterator it = jumps.begin(); it != jumps.end(); ++it) {

		const Pointer from = it->first;

		const Annotation *source_function = nullptr;
		annotations.resolve_annotation(from, &source_function);
		
		for (const JumpInfo &ji : it->second) {
			const Pointer target = ji.target;

			const Annotation *function = nullptr;
			annotations.resolve_annotation(target, &function);

			if (!function)
				continue;

			int function_index = (((uint8_t*)function)-((uint8_t*)&annotations._annotations[0]))/sizeof(Annotation);
			assert(&annotations._annotations[function_index] == function);

			FunctionInfo &fi = stats[function_index];

			if (source_function == function) {
				fi.jumps_within_function++;
			} else if (target == function->startOfRange) {
				fi.targets_inside.insert(target);
			} else {
				fi.targets_inside.insert(target);
			}
		}		
	}

	StringBuilder sb;

	writer.writeSeperator("Entry point analysis");

	for (uint32_t i = 0; i < stats.size(); i++) {
		const FunctionInfo &f = stats[i];
		int entries = f.targets_inside.size();

		const Annotation &a = annotations._annotations[i];
		if (entries>1) {
			sb.clear();
			sb.format("%s has %d entry points (function start %06X)", a.name.c_str(), entries, a.startOfRange);
			writer.writeComment(sb);
			for (Pointer t : f.targets_inside) {
				std::string label = annotations.label(t, nullptr, true);
				sb.clear();
				sb.format("    %06X %s    %s", t, t == a.startOfRange ? "(*)":"   ",label.c_str());
				writer.writeComment(sb);
			}
		} else if (entries == 1) {
			const Pointer t = *f.targets_inside.begin();
			if (t != a.startOfRange) {			
				sb.clear();
				sb.format("%s has an entry point that is not at start (%06X vs %06X)", a.name.c_str(), t, a.startOfRange);
				writer.writeComment(sb);
			}
		}
	}
*/
}